

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

string * __thiscall
om::net::mac_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,mac_addr *this)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  stringstream ss;
  undefined1 auStack_1b8 [15];
  char local_1a9;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    std::ios::widen((char)auStack_1b8 + (char)lVar1 + ' ');
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  poVar2 = (ostream *)std::ostream::operator<<(local_198,(uint)this->_addr[0]);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_addr[1]);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_addr[2]);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_addr[3]);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_addr[4]);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  std::ostream::operator<<(poVar2,(uint)this->_addr[5]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << std::hex
				   << std::setw(2) << std::setfill('0') << (int) _addr[0] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[1] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[2] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[3] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[4] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[5];
				return ss.str();
			}